

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogToStderr(void)

{
  int iVar1;
  int i;
  MutexLock local_20;
  MutexLock l;
  
  local_20.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) {
      abort();
    }
  }
  fLI::FLAGS_stderrthreshold = 0;
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  iVar1 = 0;
  do {
    LogDestination::SetLogDestination(iVar1,"");
    iVar1 = iVar1 + 1;
  } while (iVar1 != 4);
  return;
}

Assistant:

void LogToStderr() {
  LogDestination::LogToStderr();
}